

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O0

void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk,int *pCounter)

{
  Abc_Ntk_t *pNtk_00;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  void *pvVar8;
  int local_828;
  int local_824;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkModel;
  char Suffix [2000];
  int *pCounter_local;
  Abc_Ntk_t *pNtk_local;
  Abc_Ntk_t *pNtkNew_local;
  
  memset(&pNtkModel,0,2000);
  iVar2 = Abc_NtkHasBlackbox(pNtk);
  if (iVar2 == 0) {
    *pCounter = *pCounter + 1;
    if (*pCounter != 0) {
      pcVar7 = Abc_NtkName(pNtk);
      sprintf((char *)&pNtkModel,"_%s_%d",pcVar7,(ulong)(uint)*pCounter);
    }
    for (local_824 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_824 < iVar2;
        local_824 = local_824 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,local_824);
      for (local_828 = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_828 < iVar2;
          local_828 = local_828 + 1) {
        pAVar5 = Abc_ObjFanin(pAVar4,local_828);
        pAVar5 = Abc_ObjFanin0(pAVar5);
        if ((pAVar5->field_6).pTemp == (void *)0x0) {
          pcVar7 = Abc_ObjNameSuffix(pAVar5,(char *)&pNtkModel);
          pAVar6 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar7);
          (pAVar5->field_6).pCopy = pAVar6;
        }
      }
      for (local_828 = 0; iVar2 = Abc_ObjFanoutNum(pAVar4), local_828 < iVar2;
          local_828 = local_828 + 1) {
        pAVar5 = Abc_ObjFanout(pAVar4,local_828);
        pAVar5 = Abc_ObjFanout0(pAVar5);
        if ((pAVar5->field_6).pTemp == (void *)0x0) {
          pcVar7 = Abc_ObjNameSuffix(pAVar5,(char *)&pNtkModel);
          pAVar6 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar7);
          (pAVar5->field_6).pCopy = pAVar6;
        }
      }
    }
    Abc_NtkIncrementTravId(pNtk);
    for (local_824 = 0; iVar2 = Abc_NtkPiNum(pNtk), local_824 < iVar2; local_824 = local_824 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,local_824);
      Abc_NodeSetTravIdCurrent(pAVar4);
    }
    for (local_824 = 0; iVar2 = Abc_NtkPoNum(pNtk), local_824 < iVar2; local_824 = local_824 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,local_824);
      Abc_NodeSetTravIdCurrent(pAVar4);
      pAVar4 = Abc_ObjFanin0(pAVar4);
      pcVar7 = Abc_ObjName(pAVar4);
      iVar2 = strncmp(pcVar7,"abc_property",0xc);
      if (iVar2 == 0) {
        pAVar5 = Abc_NtkCreatePo(((pAVar4->field_6).pCopy)->pNtk);
        Abc_ObjAddFanin(pAVar5,(pAVar4->field_6).pCopy);
        pcVar7 = Nm_ManFindNameById(((pAVar4->field_6).pCopy)->pNtk->pManName,
                                    ((pAVar4->field_6).pCopy)->Id);
        if (pcVar7 != (char *)0x0) {
          Nm_ManDeleteIdName(((pAVar4->field_6).pCopy)->pNtk->pManName,((pAVar4->field_6).pCopy)->Id
                            );
        }
        pAVar5 = (pAVar4->field_6).pCopy;
        pcVar7 = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar5,pcVar7,(char *)&pNtkModel);
      }
    }
    for (local_824 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_824 < iVar2;
        local_824 = local_824 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,local_824);
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 == 0) {
        Abc_NodeSetTravIdCurrent(pAVar4);
        for (local_828 = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_828 < iVar2;
            local_828 = local_828 + 1) {
          pAVar5 = Abc_ObjFanin(pAVar4,local_828);
          Abc_NodeSetTravIdCurrent(pAVar5);
        }
        for (local_828 = 0; iVar2 = Abc_ObjFanoutNum(pAVar4), local_828 < iVar2;
            local_828 = local_828 + 1) {
          pAVar5 = Abc_ObjFanout(pAVar4,local_828);
          Abc_NodeSetTravIdCurrent(pAVar5);
        }
      }
    }
    for (local_824 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_824 < iVar2;
        local_824 = local_824 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,local_824);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_NodeIsTravIdCurrent(pAVar4), iVar2 == 0)) &&
         ((pAVar4->field_6).pTemp == (void *)0x0)) {
        Abc_NtkDupObj(pNtkNew,pAVar4,0);
      }
    }
    for (local_824 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_824 < iVar2;
        local_824 = local_824 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,local_824);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_NodeIsTravIdCurrent(pAVar4), iVar2 == 0)) {
        for (local_828 = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_828 < iVar2;
            local_828 = local_828 + 1) {
          pAVar5 = Abc_ObjFanin(pAVar4,local_828);
          iVar2 = Abc_NodeIsTravIdCurrent(pAVar5);
          if (iVar2 == 0) {
            Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar5->field_6).pCopy);
          }
        }
      }
    }
    for (local_824 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_824 < iVar2;
        local_824 = local_824 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,local_824);
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 == 0) {
        pNtk_00 = *(Abc_Ntk_t **)&(pAVar4->field_5).iData;
        iVar2 = Abc_ObjFaninNum(pAVar4);
        iVar3 = Abc_NtkPiNum(pNtk_00);
        if (iVar2 != iVar3) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                        ,0x97,
                        "void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
        }
        iVar2 = Abc_ObjFanoutNum(pAVar4);
        iVar3 = Abc_NtkPoNum(pNtk_00);
        if (iVar2 != iVar3) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                        ,0x98,
                        "void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
        }
        Abc_NtkCleanCopy(pNtk_00);
        for (local_828 = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_828 < iVar2;
            local_828 = local_828 + 1) {
          pAVar5 = Abc_ObjFanin(pAVar4,local_828);
          pAVar5 = Abc_ObjFanin0(pAVar5);
          aVar1 = pAVar5->field_6;
          pAVar5 = Abc_NtkPi(pNtk_00,local_828);
          pAVar5 = Abc_ObjFanout0(pAVar5);
          pAVar5->field_6 = aVar1;
        }
        for (local_828 = 0; iVar2 = Abc_ObjFanoutNum(pAVar4), local_828 < iVar2;
            local_828 = local_828 + 1) {
          pAVar5 = Abc_ObjFanout(pAVar4,local_828);
          pAVar5 = Abc_ObjFanout0(pAVar5);
          aVar1 = pAVar5->field_6;
          pAVar5 = Abc_NtkPo(pNtk_00,local_828);
          pAVar5 = Abc_ObjFanin0(pAVar5);
          pAVar5->field_6 = aVar1;
        }
        Abc_NtkFlattenLogicHierarchy2_rec(pNtkNew,pNtk_00,pCounter);
      }
    }
    iVar2 = Abc_NtkHasBlifMv(pNtk);
    if ((iVar2 != 0) && (pvVar8 = Abc_NtkMvVar(pNtk), pvVar8 != (void *)0x0)) {
      pvVar8 = Abc_NtkMvVar(pNtkNew);
      if (pvVar8 == (void *)0x0) {
        Abc_NtkStartMvVars(pNtkNew);
      }
      for (local_824 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_824 < iVar2;
          local_824 = local_824 + 1) {
        pAVar4 = Abc_NtkObj(pNtk,local_824);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNet(pAVar4), iVar2 != 0)) {
          pAVar5 = (pAVar4->field_6).pCopy;
          iVar2 = Abc_ObjMvVarNum(pAVar4);
          Abc_NtkSetMvVarValues(pAVar5,iVar2);
        }
      }
    }
  }
  else {
    iVar2 = Abc_NtkBoxNum(pNtk);
    if (iVar2 != 1) {
      __assert_fail("Abc_NtkBoxNum(pNtk) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                    ,0x39,"void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
      ;
    }
    pAVar4 = Abc_NtkBox(pNtk,0);
    Abc_NtkDupBox(pNtkNew,pAVar4,1);
    (((pAVar4->field_6).pCopy)->field_5).pData = pNtk;
    iVar2 = Abc_ObjFaninNum((pAVar4->field_6).pCopy);
    iVar3 = Abc_NtkPiNum(pNtk);
    if (iVar2 != iVar3) {
      __assert_fail("Abc_ObjFaninNum(pObj->pCopy) == Abc_NtkPiNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                    ,0x3f,"void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
      ;
    }
    for (local_824 = 0; iVar2 = Abc_NtkPiNum(pNtk), local_824 < iVar2; local_824 = local_824 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,local_824);
      pAVar6 = Abc_ObjFanin((pAVar4->field_6).pCopy,local_824);
      pAVar5 = Abc_ObjFanout0(pAVar5);
      Abc_ObjAddFanin(pAVar6,(pAVar5->field_6).pCopy);
    }
    iVar2 = Abc_ObjFanoutNum((pAVar4->field_6).pCopy);
    iVar3 = Abc_NtkPoNum(pNtk);
    if (iVar2 != iVar3) {
      __assert_fail("Abc_ObjFanoutNum(pObj->pCopy) == Abc_NtkPoNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                    ,0x44,"void Abc_NtkFlattenLogicHierarchy2_rec(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
      ;
    }
    for (local_824 = 0; iVar2 = Abc_NtkPoNum(pNtk), local_824 < iVar2; local_824 = local_824 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,local_824);
      pAVar5 = Abc_ObjFanin0(pAVar5);
      pAVar5 = (pAVar5->field_6).pCopy;
      pAVar6 = Abc_ObjFanout((pAVar4->field_6).pCopy,local_824);
      Abc_ObjAddFanin(pAVar5,pAVar6);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Recursively flattens logic hierarchy of the netlist.]

  Description [When this procedure is called, the PI/PO nets of the old 
  netlist point to the corresponding nets of the flattened netlist.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkFlattenLogicHierarchy2_rec( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk, int * pCounter )
{
    char Suffix[2000] = {0};
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj, * pTerm, * pNet, * pFanin;
    int i, k;

    // process the blackbox
    if ( Abc_NtkHasBlackbox(pNtk) )
    {
        // duplicate the blackbox
        assert( Abc_NtkBoxNum(pNtk) == 1 );
        pObj = Abc_NtkBox( pNtk, 0 );
        Abc_NtkDupBox( pNtkNew, pObj, 1 );
        pObj->pCopy->pData = pNtk;

        // connect blackbox fanins to the PI nets
        assert( Abc_ObjFaninNum(pObj->pCopy) == Abc_NtkPiNum(pNtk) );
        Abc_NtkForEachPi( pNtk, pTerm, i )
            Abc_ObjAddFanin( Abc_ObjFanin(pObj->pCopy,i), Abc_ObjFanout0(pTerm)->pCopy );

        // connect blackbox fanouts to the PO nets
        assert( Abc_ObjFanoutNum(pObj->pCopy) == Abc_NtkPoNum(pNtk) );
        Abc_NtkForEachPo( pNtk, pTerm, i )
            Abc_ObjAddFanin( Abc_ObjFanin0(pTerm)->pCopy, Abc_ObjFanout(pObj->pCopy,i) );
        return;
    }

    (*pCounter)++;

    // create the suffix, which will be appended to the internal names
    if ( *pCounter )
        sprintf( Suffix, "_%s_%d", Abc_NtkName(pNtk), *pCounter );

    // duplicate nets of all boxes, including latches
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pTerm, k )
        {
            pNet = Abc_ObjFanin0(pTerm);
            if ( pNet->pCopy )
                continue;
            pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjNameSuffix(pNet, Suffix) );
        }
        Abc_ObjForEachFanout( pObj, pTerm, k )
        {
            pNet = Abc_ObjFanout0(pTerm);
            if ( pNet->pCopy )
                continue;
            pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjNameSuffix(pNet, Suffix) );
        }
    }

    // mark objects that will not be used
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NodeSetTravIdCurrent( pTerm );
        // if the netlist has net names beginning with "abc_property_"
        // these names will be addes as primary outputs of the network
        pNet = Abc_ObjFanin0(pTerm);
        if ( strncmp( Abc_ObjName(pNet), "abc_property", 12 ) )
            continue;
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNet->pCopy->pNtk), pNet->pCopy );
        if ( Nm_ManFindNameById(pNet->pCopy->pNtk->pManName, pNet->pCopy->Id) )
            Nm_ManDeleteIdName(pNet->pCopy->pNtk->pManName, pNet->pCopy->Id);
        Abc_ObjAssignName( pNet->pCopy, Abc_ObjName(pNet), Suffix );
    }
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_NodeSetTravIdCurrent( pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_NodeSetTravIdCurrent( pTerm );
    }

    // duplicate objects that do not have prototypes yet
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        if ( pObj->pCopy )
            continue;
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    }

    // connect objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // call recursively
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
        // clean the node copy fields
        Abc_NtkCleanCopy( pNtkModel );
        // map PIs/POs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->pCopy = Abc_ObjFanin0(pTerm)->pCopy;
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->pCopy = Abc_ObjFanout0(pTerm)->pCopy;
        // call recursively
        Abc_NtkFlattenLogicHierarchy2_rec( pNtkNew, pNtkModel, pCounter );
    }

    // if it is a BLIF-MV netlist transfer the values of all nets
    if ( Abc_NtkHasBlifMv(pNtk) && Abc_NtkMvVar(pNtk) )
    {
        if ( Abc_NtkMvVar( pNtkNew ) == NULL )
            Abc_NtkStartMvVars( pNtkNew );
        Abc_NtkForEachNet( pNtk, pObj, i )
            Abc_NtkSetMvVarValues( pObj->pCopy, Abc_ObjMvVarNum(pObj) );
    }
}